

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DisposeOutRec(Clipper *this,size_type index)

{
  value_type pOVar1;
  reference ppOVar2;
  OutRec *outRec;
  size_type index_local;
  Clipper *this_local;
  
  ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                      (&this->m_PolyOuts,index);
  pOVar1 = *ppOVar2;
  if (pOVar1->pts != (OutPt *)0x0) {
    DisposeOutPts(&pOVar1->pts);
  }
  if (pOVar1 != (value_type)0x0) {
    operator_delete(pOVar1);
  }
  ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                      (&this->m_PolyOuts,index);
  *ppOVar2 = (value_type)0x0;
  return;
}

Assistant:

void Clipper::DisposeOutRec(PolyOutList::size_type index)
{
  OutRec *outRec = m_PolyOuts[index];
  if (outRec->pts) DisposeOutPts(outRec->pts);
  delete outRec;
  m_PolyOuts[index] = 0;
}